

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderPackingFunctionCase::ShaderPackingFunctionCase
          (ShaderPackingFunctionCase *this,Context *context,char *name,char *description,
          ShaderType shaderType)

{
  ContextType type;
  GLSLVersion GVar1;
  RenderContext *pRVar2;
  ShaderType shaderType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderPackingFunctionCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPackingFunctionCase_011c33f0;
  this->m_shaderType = shaderType;
  gls::ShaderExecUtil::ShaderSpec::ShaderSpec(&this->m_spec);
  this->m_executor = (ShaderExecutor *)0x0;
  pRVar2 = Context::getRenderContext(context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  GVar1 = glu::getContextTypeGLSLVersion(type);
  (this->m_spec).version = GVar1;
  return;
}

Assistant:

ShaderPackingFunctionCase::ShaderPackingFunctionCase (Context& context, const char* name, const char* description, glu::ShaderType shaderType)
	: TestCase		(context, name, description)
	, m_shaderType	(shaderType)
	, m_executor	(DE_NULL)
{
	m_spec.version = glu::getContextTypeGLSLVersion(context.getRenderContext().getType());
}